

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O2

int run_test_tcp_read_stop_start(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_20;
  sockaddr_in addr;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(uVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server,&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&server,10,on_connection);
        if (iVar1 == 0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          if (iVar1 == 0) {
            iVar1 = uv_tcp_init(uVar2,&client);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_connect(&connect_req,&client,&addr,on_connect);
              if (iVar1 == 0) {
                iVar1 = uv_run(uVar2,0);
                if (iVar1 == 0) {
                  if (read_cb_called < 2) {
                    pcVar3 = "read_cb_called >= 2";
                    uStack_20 = 0x84;
                  }
                  else {
                    uVar2 = uv_default_loop();
                    uv_walk(uVar2,close_walk_cb,0);
                    uv_run(uVar2,0);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar2);
                    if (iVar1 == 0) {
                      uv_library_shutdown();
                      return 0;
                    }
                    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                    uStack_20 = 0x86;
                  }
                }
                else {
                  pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                  uStack_20 = 0x82;
                }
              }
              else {
                pcVar3 = 
                "0 == uv_tcp_connect(&connect_req, &client, (const struct sockaddr*) & addr, on_connect)"
                ;
                uStack_20 = 0x7f;
              }
            }
            else {
              pcVar3 = "0 == uv_tcp_init(loop, &client)";
              uStack_20 = 0x7c;
            }
          }
          else {
            pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
            uStack_20 = 0x7a;
          }
        }
        else {
          pcVar3 = "0 == uv_listen((uv_stream_t*)&server, 10, on_connection)";
          uStack_20 = 0x74;
        }
      }
      else {
        pcVar3 = "0 == uv_tcp_bind(&server, (struct sockaddr*) & addr, 0)";
        uStack_20 = 0x72;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(loop, &server)";
      uStack_20 = 0x70;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uStack_20 = 0x6e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-read-stop-start.c"
          ,uStack_20,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_read_stop_start) {
  uv_loop_t* loop = uv_default_loop();

  { /* Server */
    struct sockaddr_in addr;

    ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

    ASSERT(0 == uv_tcp_init(loop, &server));

    ASSERT(0 == uv_tcp_bind(&server, (struct sockaddr*) & addr, 0));

    ASSERT(0 == uv_listen((uv_stream_t*)&server, 10, on_connection));
  }

  { /* Client */
    struct sockaddr_in addr;

    ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

    ASSERT(0 == uv_tcp_init(loop, &client));

    ASSERT(0 == uv_tcp_connect(&connect_req, &client,
                               (const struct sockaddr*) & addr, on_connect));
  }

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(read_cb_called >= 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}